

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O2

void __thiscall
BSDFEnergyConservation_LambertianReflection_Test::~BSDFEnergyConservation_LambertianReflection_Test
          (BSDFEnergyConservation_LambertianReflection_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(BSDFEnergyConservation, LambertianReflection) {
    TestEnergyConservation(
        [](const SurfaceInteraction& si, Allocator alloc) -> BSDF* {
            return alloc.new_object<BSDF>(
                si.wo, si.n, si.shading.n, si.shading.dpdu,
                alloc.new_object<DiffuseBxDF>(SampledSpectrum(1.f), SampledSpectrum(0.),
                                              0));
        },
        "LambertianReflection");
}